

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

Mark __thiscall YAML::Node::Mark(Node *this)

{
  undefined8 uVar1;
  Mark *pMVar2;
  byte *in_RDI;
  Mark MVar3;
  string *in_stack_00000008;
  InvalidNode *in_stack_00000010;
  undefined8 local_38;
  int local_30;
  undefined8 local_c;
  int local_4;
  
  if ((*in_RDI & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x40);
    InvalidNode::InvalidNode(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar1,&InvalidNode::typeinfo,InvalidNode::~InvalidNode);
  }
  if (*(long *)(in_RDI + 0x38) == 0) {
    MVar3 = YAML::Mark::null_mark();
    local_38 = MVar3._0_8_;
    local_c = local_38;
    local_30 = MVar3.column;
    local_4 = local_30;
  }
  else {
    pMVar2 = detail::node::mark((node *)0x9e0df6);
    local_c._0_4_ = pMVar2->pos;
    local_c._4_4_ = pMVar2->line;
    local_4 = pMVar2->column;
  }
  MVar3.column = local_4;
  MVar3.pos = (undefined4)local_c;
  MVar3.line = local_c._4_4_;
  return MVar3;
}

Assistant:

inline Mark Node::Mark() const {
  if (!m_isValid) {
    throw InvalidNode(m_invalidKey);
  }
  return m_pNode ? m_pNode->mark() : Mark::null_mark();
}